

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::remove_attribute(xml_attribute_struct *attr,xml_node_struct *node)

{
  xml_node_struct *node_local;
  xml_attribute_struct *attr_local;
  
  if (attr->next_attribute == (xml_attribute_struct *)0x0) {
    node->first_attribute->prev_attribute_c = attr->prev_attribute_c;
  }
  else {
    attr->next_attribute->prev_attribute_c = attr->prev_attribute_c;
  }
  if (attr->prev_attribute_c->next_attribute == (xml_attribute_struct *)0x0) {
    node->first_attribute = attr->next_attribute;
  }
  else {
    attr->prev_attribute_c->next_attribute = attr->next_attribute;
  }
  attr->prev_attribute_c = (xml_attribute_struct *)0x0;
  attr->next_attribute = (xml_attribute_struct *)0x0;
  return;
}

Assistant:

inline void remove_attribute(xml_attribute_struct* attr, xml_node_struct* node)
	{
		if (attr->next_attribute)
			attr->next_attribute->prev_attribute_c = attr->prev_attribute_c;
		else
			node->first_attribute->prev_attribute_c = attr->prev_attribute_c;

		if (attr->prev_attribute_c->next_attribute)
			attr->prev_attribute_c->next_attribute = attr->next_attribute;
		else
			node->first_attribute = attr->next_attribute;

		attr->prev_attribute_c = 0;
		attr->next_attribute = 0;
	}